

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O3

string * __thiscall
cmDebugServerJson::StatusString_abi_cxx11_(string *__return_storage_ptr__,cmDebugServerJson *this)

{
  Int value_00;
  bool bVar1;
  int iVar2;
  SnapshotType SVar3;
  LongLong value_01;
  Value *pVVar4;
  cmListFileContext *pcVar5;
  Value *pVVar6;
  cmPauseContext ctx;
  string state;
  Value value;
  cmListFileBacktrace backtrace;
  Value back;
  cmListFileContext currentLine;
  Value frame;
  Int local_3f4;
  cmPauseContext local_3e8;
  long *local_3d0 [2];
  long local_3c0 [2];
  Value local_3b0;
  cmListFileBacktrace local_388;
  cmStateSnapshot local_368;
  Value local_348;
  Value local_320;
  Value local_2f8;
  Value local_2d0;
  Value local_2a8;
  cmListFileContext local_280;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0);
  Json::Value::Value(&local_3b0,nullValue);
  value_01 = cmsys::SystemInformation::GetProcessId(&::info);
  Json::Value::Value(&local_2a8,value_01);
  pVVar4 = Json::Value::operator[](&local_3b0,"PID");
  Json::Value::operator=(pVVar4,&local_2a8);
  Json::Value::~Value(&local_2a8);
  iVar2 = (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[9])();
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    goto LAB_004610f4;
  }
  if (iVar2 == 1) {
    Json::Value::Value(&local_2d0,"Running");
    pVVar4 = Json::Value::operator[](&local_3b0,"State");
    Json::Value::operator=(pVVar4,&local_2d0);
    pVVar4 = &local_2d0;
LAB_004610e0:
    Json::Value::~Value(pVVar4);
  }
  else if (iVar2 == 2) {
    Json::Value::Value(&local_2f8,"Paused");
    pVVar4 = Json::Value::operator[](&local_3b0,"State");
    Json::Value::operator=(pVVar4,&local_2f8);
    Json::Value::~Value(&local_2f8);
    Json::Value::Value(&local_348,arrayValue);
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
              (&local_3e8);
    bVar1 = cmPauseContext::operator_cast_to_bool(&local_3e8);
    if (bVar1) {
      cmPauseContext::CurrentLine(&local_280,&local_3e8);
      cmPauseContext::GetBacktrace(&local_388,&local_3e8);
      local_3f4 = 0;
      while (pcVar5 = cmListFileBacktrace::Top(&local_388), (pcVar5->FilePath)._M_string_length != 0
            ) {
        pcVar5 = cmListFileBacktrace::Top(&local_388);
        value_00 = (Int)pcVar5->Line;
        if (value_00 != 0) {
          Json::Value::Value(&local_a8,objectValue);
          Json::Value::Value(&local_58,local_3f4);
          pVVar4 = Json::Value::operator[](&local_a8,"ID");
          Json::Value::operator=(pVVar4,&local_58);
          Json::Value::~Value(&local_58);
          pcVar5 = cmListFileBacktrace::Top(&local_388);
          Json::Value::Value(&local_80,&pcVar5->FilePath);
          pVVar4 = Json::Value::operator[](&local_a8,"File");
          Json::Value::operator=(pVVar4,&local_80);
          Json::Value::~Value(&local_80);
          Json::Value::Value(&local_d0,value_00);
          pVVar4 = Json::Value::operator[](&local_a8,"Line");
          Json::Value::operator=(pVVar4,&local_d0);
          Json::Value::~Value(&local_d0);
          pcVar5 = cmListFileBacktrace::Top(&local_388);
          Json::Value::Value(&local_f8,&pcVar5->Name);
          pVVar4 = Json::Value::operator[](&local_a8,"Name");
          Json::Value::operator=(pVVar4,&local_f8);
          Json::Value::~Value(&local_f8);
          local_368.Position.Position = local_388.Bottom.Position.Position;
          local_368.State = local_388.Bottom.State;
          local_368.Position.Tree = local_388.Bottom.Position.Tree;
          SVar3 = cmStateSnapshot::GetType(&local_368);
          switch(SVar3) {
          case BaseType:
            Json::Value::Value(&local_120,"BaseType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_120;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case BuildsystemDirectoryType:
            Json::Value::Value(&local_148,"BuildsystemDirectoryType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_148;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case FunctionCallType:
            Json::Value::Value(&local_170,"FunctionCallType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_170;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case MacroCallType:
            Json::Value::Value(&local_198,"MacroCallType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_198;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case IncludeFileType:
            Json::Value::Value(&local_1c0,"IncludeFileType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_1c0;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case InlineListFileType:
            Json::Value::Value(&local_1e8,"InlineListFileType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_1e8;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case PolicyScopeType:
            Json::Value::Value(&local_210,"PolicyScopeType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_210;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          case VariableScopeType:
            Json::Value::Value(&local_238,"VariableScopeType");
            pVVar6 = Json::Value::operator[](&local_a8,"Type");
            pVVar4 = &local_238;
            Json::Value::operator=(pVVar6,pVVar4);
            break;
          default:
            goto switchD_00460dc7_default;
          }
          Json::Value::~Value(pVVar4);
switchD_00460dc7_default:
          Json::Value::append(&local_348,&local_a8);
          local_3f4 = local_3f4 + 1;
          Json::Value::~Value(&local_a8);
        }
        cmListFileBacktrace::Pop((cmListFileBacktrace *)&local_a8,&local_388);
        cmListFileBacktrace::operator=(&local_388,(cmListFileBacktrace *)&local_a8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_a8);
      }
      Json::Value::Value(&local_320,&local_348);
      pVVar4 = Json::Value::operator[](&local_3b0,"Backtrace");
      Json::Value::operator=(pVVar4,&local_320);
      Json::Value::~Value(&local_320);
      cmListFileBacktrace::~cmListFileBacktrace(&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.FilePath._M_dataplus._M_p != &local_280.FilePath.field_2) {
        operator_delete(local_280.FilePath._M_dataplus._M_p,
                        local_280.FilePath.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280.Name._M_dataplus._M_p != &local_280.Name.field_2) {
        operator_delete(local_280.Name._M_dataplus._M_p,
                        local_280.Name.field_2._M_allocated_capacity + 1);
      }
    }
    std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&local_3e8.Lock);
    pVVar4 = &local_348;
    goto LAB_004610e0;
  }
  Json::Value::toStyledString_abi_cxx11_(__return_storage_ptr__,&local_3b0);
LAB_004610f4:
  Json::Value::~Value(&local_3b0);
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmDebugServerJson::StatusString() const
{
  std::string state = "";
  Json::Value value;
  value["PID"] = info.GetProcessId();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      value["State"] = "Running";
      break;
    case cmDebugger::State::Paused: {
      value["State"] = "Paused";
      Json::Value back(Json::arrayValue);

      if (auto ctx = Debugger.PauseContext()) {
        auto currentLine = ctx.CurrentLine();
        auto backtrace = ctx.GetBacktrace();
        int id = 0;
        while (!backtrace.Top().FilePath.empty()) {
          auto line = Json::Value::Int(backtrace.Top().Line);
          if (line != 0) {
            Json::Value frame(Json::objectValue);
            frame["ID"] = id++;
            frame["File"] = backtrace.Top().FilePath;
            frame["Line"] = line;
            frame["Name"] = backtrace.Top().Name;

            switch (backtrace.GetBottom().GetType()) {
              case cmStateEnums::BaseType:
                frame["Type"] = "BaseType";
                break;
              case cmStateEnums::BuildsystemDirectoryType:
                frame["Type"] = "BuildsystemDirectoryType";
                break;
              case cmStateEnums::FunctionCallType:
                frame["Type"] = "FunctionCallType";
                break;
              case cmStateEnums::MacroCallType:
                frame["Type"] = "MacroCallType";
                break;
              case cmStateEnums::IncludeFileType:
                frame["Type"] = "IncludeFileType";
                break;
              case cmStateEnums::InlineListFileType:
                frame["Type"] = "InlineListFileType";
                break;
              case cmStateEnums::PolicyScopeType:
                frame["Type"] = "PolicyScopeType";
                break;
              case cmStateEnums::VariableScopeType:
                frame["Type"] = "VariableScopeType";
                break;
            }

            back.append(frame);
          }
          backtrace = backtrace.Pop();
        }
        value["Backtrace"] = back;
      }

    } break;
    case cmDebugger::State::Unknown:
      return "";
  }

  return value.toStyledString();
}